

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_list.c
# Opt level: O0

void insertElement(VM *vm,ObjList *objList,uint32_t index,Value value)

{
  uint32_t uVar1;
  undefined4 uVar2;
  Value *pVVar3;
  Value *pVVar4;
  uint local_44;
  uint32_t idx;
  uint32_t index_local;
  ObjList *objList_local;
  VM *vm_local;
  Value value_local;
  
  if ((objList->elements).count - 1 < index) {
    errorReport((void *)0x0,ERROR_RUNTIME,"index out bounded!");
  }
  ValueBufferAdd(vm,&objList->elements,(Value)ZEXT816(1));
  uVar1 = (objList->elements).count;
  while (local_44 = uVar1 - 1, index < local_44) {
    pVVar3 = (objList->elements).datas + local_44;
    pVVar4 = (objList->elements).datas + (uVar1 - 2);
    uVar2 = *(undefined4 *)&pVVar4->field_0x4;
    pVVar3->type = pVVar4->type;
    *(undefined4 *)&pVVar3->field_0x4 = uVar2;
    pVVar3->field_1 = pVVar4->field_1;
    uVar1 = local_44;
  }
  pVVar3 = (objList->elements).datas + index;
  *(ulong *)pVVar3 = CONCAT44(vm_local._4_4_,value.type);
  pVVar3->field_1 = value.field_1;
  return;
}

Assistant:

void insertElement(VM *vm, ObjList *objList, uint32_t index, Value value) {
    if (index > objList->elements.count - 1) {
        RUN_ERROR("index out bounded!");
    }

    // 增加一个空位
    ValueBufferAdd(vm, &objList->elements, VT_TO_VALUE(VT_NULL));

    // index后面的元素整体后移一位
    uint32_t idx = objList->elements.count - 1;
    while (idx > index) {
        objList->elements.datas[idx] = objList->elements.datas[idx - 1];
        idx--;
    }

    // 插入Value
    objList->elements.datas[index] = value;
}